

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  ContextType CVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar5;
  iterator iVar3;
  TestError *pTVar4;
  allocator<char> local_340;
  allocator<char> local_33f;
  allocator<char> local_33e;
  allocator<char> local_33d;
  allocator<char> local_33c;
  allocator<char> local_33b;
  allocator<char> local_33a;
  allocator<char> local_339;
  ExpressionsDynamicIndexing2<glcts::ArraysOfArrays::Interface::GL> *local_338;
  undefined4 local_32c;
  ulong local_328;
  undefined8 local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string shader_source;
  string invalid_size_declarations [15];
  
  local_338 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_size_declarations,"[0][0][0][y]",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 1),"[0][0][y][0]",(allocator<char> *)&local_258)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 2),"[0][y][0][0]",(allocator<char> *)&local_278)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 3),"[y][0][0][0]",(allocator<char> *)&local_2d8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 4),"[0][0][y][y]",(allocator<char> *)&local_2f8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 5),"[0][y][0][y]",(allocator<char> *)&local_298)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 6),"[y][0][0][y]",(allocator<char> *)&local_2b8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 7),"[0][y][y][0]",&local_339);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 8),"[y][0][y][0]",&local_33a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 9),"[y][y][0][0]",&local_33b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 10),"[0][y][y][y]",&local_33c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xb),"[y][0][y][y]",&local_33d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xc),"[y][y][0][y]",&local_33e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xd),"[y][y][y][0]",&local_33f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xe),"[y][y][y][y]",&local_340);
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((local_338->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)
                  ->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  uVar5 = extraout_var;
  if (!bVar1) {
    CVar2.super_ApiType.m_bits =
         (ApiType)(*((local_338->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                    context_id)->m_renderCtx->_vptr_RenderContext[2])();
    bVar1 = glu::contextSupports(CVar2,(ApiType)0x104);
    uVar5 = extraout_var_00;
    if ((!bVar1) &&
       (bVar1 = glu::ContextInfo::isExtensionSupported
                          (((local_338->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).
                           context_id)->m_contextInfo,"GL_EXT_gpu_shader5"), uVar5 = extraout_var_01
       , !bVar1)) {
      local_32c = 0;
      goto LAB_00b96ea3;
    }
  }
  local_32c = (undefined4)CONCAT71(uVar5,1);
LAB_00b96ea3:
  local_328 = (ulong)tested_shader_type;
  local_320 = 0;
  iVar3 = std::
          _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
          ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                  *)supported_variable_types_map,(key_type *)opaque_var_types);
  if (iVar3._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xd63);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &iVar3._M_node[2]._M_parent;
  local_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &iVar3._M_node[1]._M_parent;
  local_310 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &iVar3._M_node[0xb]._M_parent;
  local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &iVar3._M_node[10]._M_parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader_source,"int y = 1;\n",(allocator<char> *)&local_258);
  std::operator+(&local_2f8,"uniform ",local_300);
  std::operator+(&local_2d8,&local_2f8," ");
  std::operator+(&local_278,&local_2d8,local_308);
  std::operator+(&local_258,&local_278," x[2][2][2][2];\n\n");
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::append((char *)&shader_source);
  std::__cxx11::string::append((char *)&shader_source);
  std::operator+(&local_2b8,"    ",local_310);
  std::operator+(&local_298,&local_2b8," color = texture(x");
  std::operator+(&local_2f8,&local_298,invalid_size_declarations);
  std::operator+(&local_2d8,&local_2f8,", ");
  std::operator+(&local_278,&local_2d8,local_318);
  std::operator+(&local_258,&local_278,");\n");
  std::__cxx11::string::append((string *)&shader_source);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (tested_shader_type < SHADER_TYPE_LAST) {
    (*(code *)(&DAT_01722c6c + *(int *)(&DAT_01722c6c + local_328 * 4)))();
    return;
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xd55);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsDynamicIndexing2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int				  num_var_types				  = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);
	const std::string invalid_size_declarations[] = { "[0][0][0][y]", "[0][0][y][0]", "[0][y][0][0]", "[y][0][0][0]",
													  "[0][0][y][y]", "[0][y][0][y]", "[y][0][0][y]", "[0][y][y][0]",
													  "[y][0][y][0]", "[y][y][0][0]", "[0][y][y][y]", "[y][0][y][y]",
													  "[y][y][0][y]", "[y][y][y][0]", "[y][y][y][y]" };

	bool dynamic_indexing_supported = false;
	if (glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::es(3, 2)) ||
		glu::contextSupports(this->context_id.getRenderContext().getType(), glu::ApiType::core(4, 0)) ||
		this->context_id.getContextInfo().isExtensionSupported("GL_EXT_gpu_shader5"))
	{
		dynamic_indexing_supported = true;
	}

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			int num_invalid_size_declarations =
				sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);

			for (int invalid_size_index = 0; invalid_size_index < num_invalid_size_declarations; invalid_size_index++)
			{
				std::string shader_source = "int y = 1;\n";

				shader_source += "uniform " + var_iterator->second.precision + " " + var_iterator->second.type +
								 " x[2][2][2][2];\n\n";
				shader_source += "void main()\n";
				shader_source += "{\n";
				shader_source += ("    " + var_iterator->second.type_of_result_of_texture_function +
								  " color = texture(x" + invalid_size_declarations[invalid_size_index] + ", " +
								  var_iterator->second.coord_param_for_texture_function + ");\n");

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				if (dynamic_indexing_supported)
				{
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, true);
				}
				else
				{
					this->execute_negative_test(tested_shader_type, shader_source);
				}
			} /* for (int invalid_size_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}